

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::Transaction::Transaction(Transaction *this,Transaction *transaction)

{
  string local_38;
  Transaction *local_18;
  Transaction *transaction_local;
  Transaction *this_local;
  
  local_18 = transaction;
  transaction_local = this;
  AbstractTransaction::GetHex_abi_cxx11_(&local_38,&transaction->super_AbstractTransaction);
  Transaction(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Transaction::Transaction(const Transaction &transaction)
    : Transaction(transaction.GetHex()) {
  // copy constructor
}